

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmAuxTableULT.h
# Opt level: O3

int __thiscall CTestAuxTable::Surface::init(Surface *this,EVP_PKEY_CTX *ctx)

{
  GMM_GFX_ADDRESS GVar1;
  GMM_CLIENT_CONTEXT *pGVar2;
  char cVar3;
  undefined4 uVar4;
  GMM_RESOURCE_INFO *pGVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  undefined8 uStack_98;
  GMM_REQ_OFFSET_INFO ReqInfo;
  
  pGVar5 = (GMM_RESOURCE_INFO *)(**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))();
  this->mResInfo = pGVar5;
  lVar6 = (**(code **)(*(long *)pGVar5 + 0x288))(pGVar5);
  lVar7 = (**(code **)(*(long *)this->mResInfo + 0x118))();
  bVar11 = (*(ulong *)(lVar7 + 8) >> 0x25 & 1) == 0;
  uVar10 = 0xffffffffffffc000;
  if (bVar11) {
    uVar10 = 0xffffffffffff0000;
  }
  lVar7 = 0x4000;
  if (bVar11) {
    lVar7 = 0x10000;
  }
  pvVar8 = (void *)aligned_alloc(lVar7,lVar6 + -1 + lVar7 & uVar10);
  this->mBuf = pvVar8;
  pGVar5 = this->mResInfo;
  if (pvVar8 != (void *)0x0 && pGVar5 != (GMM_RESOURCE_INFO *)0x0) {
    this->mYBase = (GMM_GFX_ADDRESS)pvVar8;
    this->mUVBase = 0;
    lVar7 = (**(code **)(*(long *)pGVar5 + 0x2a0))(pGVar5,1);
    this->mAuxYBase = lVar7 + (long)pvVar8;
    this->mAuxUVBase = 0;
    sVar9 = (**(code **)(*(long *)this->mResInfo + 0x280))();
    this->mYPlaneSize = sVar9;
    pGVar2 = CommonULT::pGmmULTClientContext;
    uVar4 = (**(code **)(*(long *)this->mResInfo + 0x128))();
    cVar3 = (**(code **)(*(long *)pGVar2 + 0x98))(pGVar2,uVar4);
    if (cVar3 != '\0') {
      ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      ReqInfo.Plane = GMM_NO_PLANE;
      ReqInfo._0_4_ = 0;
      ReqInfo.ArrayIndex = 0;
      ReqInfo.StdLayout.Offset = 0;
      ReqInfo.StdLayout.TileRowPitch = 0;
      ReqInfo.Render.XOffset = 0;
      ReqInfo.Render.YOffset = 0;
      ReqInfo.Render.ZOffset = 0;
      ReqInfo.Render._20_4_ = 0;
      ReqInfo.Lock.Pitch = 0;
      ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      ReqInfo.Render.field_0.Offset64 = 0;
      ReqInfo.Frame = GMM_DISPLAY_BASE;
      ReqInfo._28_4_ = 0;
      ReqInfo.Lock.field_0.Offset64 = 0;
      ReqInfo.MipLevel = 0;
      ReqInfo.Slice = 2;
      uStack_98 = 1;
      (**(code **)(*(long *)this->mResInfo + 0x68))(this->mResInfo,&uStack_98);
      this->mYPlaneSize = ReqInfo.Lock._8_8_;
      GVar1 = this->mYBase;
      this->mUVBase = ReqInfo.Lock._8_8_ + GVar1;
      lVar7 = (**(code **)(*(long *)this->mResInfo + 0x2a0))(this->mResInfo,3);
      this->mAuxUVBase = lVar7 + GVar1;
    }
    lVar7 = (**(code **)(*(long *)this->mResInfo + 0x280))();
    this->mUVPlaneSize = lVar7 - this->mYPlaneSize;
  }
  return (int)CONCAT71((int7)((ulong)lVar6 >> 8),
                       pvVar8 != (void *)0x0 && pGVar5 != (GMM_RESOURCE_INFO *)0x0);
}

Assistant:

bool init()
        {
            size_t size;
            size_t alignment;

            GMM_RESCREATE_PARAMS gmmParams       = {};
            gmmParams.Type                       = RESOURCE_2D;
            gmmParams.Format                     = GMM_FORMAT_NV12;
            gmmParams.BaseWidth                  = mWidth;
            gmmParams.BaseHeight                 = mHeight;
            gmmParams.Depth                      = 0x1;
            gmmParams.ArraySize                  = 1;
            gmmParams.Flags.Info.TiledY          = 1;
            gmmParams.Flags.Info.MediaCompressed = mMMC ? 1 : 0;
            //gmmParams.Flags.Gpu.CCS               = mmc ? 1 : 0;
            gmmParams.Flags.Gpu.MMC               = mMMC ? 1 : 0;
            gmmParams.Flags.Gpu.Texture           = 1;
            gmmParams.Flags.Gpu.RenderTarget      = 1;
            gmmParams.Flags.Gpu.UnifiedAuxSurface = mMMC ? 1 : 0;
            //gmmParams.Flags.Gpu.Depth             = 1;
            gmmParams.Flags.Gpu.Video = true;

            mResInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            size = mResInfo->GetSizeSurface();

            alignment = mResInfo->GetResFlags().Info.TiledYf ? GMM_KBYTE(16) : GMM_KBYTE(64);

            mBuf = aligned_alloc(alignment, ALIGN(size, alignment));

            if(!mResInfo || !mBuf)
                return false;

            mYBase      = (GMM_GFX_ADDRESS)mBuf;
            mUVBase     = 0;
            mAuxYBase   = mYBase + mResInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS);
            mAuxUVBase  = 0;
            mYPlaneSize = mResInfo->GetSizeMainSurface();

            if(pGmmULTClientContext->IsPlanar(mResInfo->GetResourceFormat()))
            {
                GMM_REQ_OFFSET_INFO ReqInfo = {0};
                ReqInfo.Plane               = GMM_PLANE_U;
                ReqInfo.ReqRender           = 1;

                mResInfo->GetOffset(ReqInfo);
                mYPlaneSize = ReqInfo.Render.Offset64;

                mUVBase    = mYBase + mYPlaneSize;
                mAuxUVBase = mYBase + mResInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS);
            }

            mUVPlaneSize = mResInfo->GetSizeMainSurface() - mYPlaneSize;

            return true;
        }